

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

QString * __thiscall
MakefileGenerator::createSedArgs
          (QString *__return_storage_ptr__,MakefileGenerator *this,ProKey *replace_rule,
          QString *file_name)

{
  QMakeProject *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  longlong __old_val;
  ProStringList *pPVar8;
  long lVar9;
  MakefileGenerator *pMVar10;
  QArrayData *unaff_R12;
  ulong uVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QStringView QVar13;
  QStringView config;
  QLatin1String QVar14;
  ProString filename;
  ProString replace;
  ProString match;
  QString local_268;
  QString local_250;
  QString local_238;
  QString local_220;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
  local_208;
  undefined1 local_1c8 [32];
  Data *local_1a8;
  QMakeLocalFileName *local_1a0;
  char16_t *pcStack_198;
  Data *local_190;
  char *local_188;
  QString local_180;
  QStringBuilder<const_char_(&)[5],_QString> local_168;
  ProString local_148;
  ProString local_118;
  QString local_e8;
  undefined1 local_c8 [28];
  int iStack_ac;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [28];
  int iStack_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar5 = QMakeProject::isEmpty(this->project,replace_rule);
  if (bVar5) {
    bVar6 = false;
  }
  else {
    pQVar1 = this->project;
    QVar12.m_data = (storage_type *)0x13;
    QVar12.m_size = (qsizetype)local_1c8;
    QString::fromUtf8(QVar12);
    unaff_R12 = (QArrayData *)local_1c8._0_8_;
    config.m_data = (storage_type_conflict *)local_1c8._8_8_;
    config.m_size = local_1c8._16_8_;
    bVar6 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    bVar6 = !bVar6;
  }
  if (!bVar5 && unaff_R12 != (QArrayData *)0x0) {
    LOCK();
    (unaff_R12->ref_)._q_value.super___atomic_base<int>._M_i =
         (unaff_R12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((unaff_R12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(unaff_R12,2,0x10);
    }
  }
  if ((bVar6) &&
     (pPVar8 = QMakeEvaluator::valuesRef(&this->project->super_QMakeEvaluator,replace_rule),
     (pPVar8->super_QList<ProString>).d.size != 0)) {
    lVar9 = 0;
    uVar11 = 0;
    do {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = this->project;
      local_208.a.a.a =
           (char (*) [3])((long)&(((pPVar8->super_QList<ProString>).d.ptr)->m_string).d.d + lVar9);
      local_208.a.a.b.d.d = (Data *)0x2a98e3;
      ProString::ProString<ProString_const&,char_const(&)[7]>
                ((ProString *)local_1c8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_208);
      QMakeEvaluator::first((ProString *)local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_1c8)
      ;
      if ((QArrayData *)local_1c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_1c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_1c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_1c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
        }
      }
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = this->project;
      local_208.a.a.a =
           (char (*) [3])((long)&(((pPVar8->super_QList<ProString>).d.ptr)->m_string).d.d + lVar9);
      local_208.a.a.b.d.d = (Data *)0x2a98ea;
      ProString::ProString<ProString_const&,char_const(&)[9]>
                ((ProString *)local_1c8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&local_208);
      QMakeEvaluator::first((ProString *)local_98,&pQVar1->super_QMakeEvaluator,(ProKey *)local_1c8)
      ;
      if ((QArrayData *)local_1c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_1c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_1c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_1c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
        }
      }
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffff50 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = this->project;
      local_208.a.a.a =
           (char (*) [3])((long)&(((pPVar8->super_QList<ProString>).d.ptr)->m_string).d.d + lVar9);
      local_208.a.a.b.d.d = (Data *)0x2a98f3;
      ProString::ProString<ProString_const&,char_const(&)[10]>
                ((ProString *)local_1c8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)&local_208);
      QMakeEvaluator::first((ProString *)local_c8,&pQVar1->super_QMakeEvaluator,(ProKey *)local_1c8)
      ;
      if ((QArrayData *)local_1c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_1c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_1c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_1c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_1c8._0_8_,2,0x10);
        }
      }
      if ((iStack_4c != 0) &&
         ((iStack_ac == 0 || (bVar5 = ProString::operator==((ProString *)local_c8,file_name), bVar5)
          ))) {
        local_1c8._0_8_ = "s,";
        local_1c8._8_8_ = local_68;
        local_1c8._16_8_ = ",";
        local_1c8._24_8_ = local_98;
        local_1a8 = (Data *)0x2a9905;
        pMVar10 = (MakefileGenerator *)local_1c8;
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_const_ProString_&>,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[3]>
        ::convertTo<QString>
                  (&local_e8,
                   (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_const_ProString_&>,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[3]>
                    *)local_1c8);
        shellQuote((QString *)&local_168,pMVar10,&local_e8);
        local_208.a.a.b.d.size = (qsizetype)local_168.b.d.ptr;
        local_208.a.a.b.d.ptr = (char16_t *)local_168.b.d.d;
        local_208.a.a.b.d.d = (Data *)local_168.a;
        local_208.a.a.a = (char (*) [3])0x2a98fd;
        local_168.a = (char (*) [5])0x0;
        local_168.b.d.d = (Data *)0x0;
        local_168.b.d.ptr = (char16_t *)0x0;
        ::operator+=(__return_storage_ptr__,(QStringBuilder<const_char_(&)[5],_QString> *)&local_208
                    );
        if (&(local_208.a.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_208.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_208.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if (((local_208.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate(&(local_208.a.a.b.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_168.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)*local_168.a)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)*local_168.a)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)*local_168.a)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_168.a,2,0x10);
          }
        }
        if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (Option::dir_sep.d.size == 1) {
          QVar13.m_data = Option::dir_sep.d.ptr;
          QVar13.m_size = 1;
          QVar14.m_data = "\\";
          QVar14.m_size = 1;
          cVar7 = QtPrivate::equalStrings(QVar13,QVar14);
        }
        else {
          cVar7 = '\0';
        }
        if (cVar7 == '\0') {
          bVar5 = false;
        }
        else {
          pQVar1 = this->project;
          local_1c8._0_8_ = (long)&(((pPVar8->super_QList<ProString>).d.ptr)->m_string).d.d + lVar9;
          local_1c8._8_8_ = ".CONFIG";
          ProString::ProString<ProString_const&,char_const(&)[8]>
                    (&local_148,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)local_1c8);
          QMakeEvaluator::first(&local_118,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_148);
          bVar5 = ProString::contains(&local_118,"path",CaseSensitive);
          if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((Data *)local_148.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((local_148.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_148.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_148.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_148.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if (bVar5 != false) {
          ProString::toQString(&local_238,(ProString *)local_68);
          windowsifyPath(&local_220,&local_238);
          qVar4 = local_220.d.size;
          pcVar3 = local_220.d.ptr;
          pDVar2 = local_220.d.d;
          local_220.d.d = (Data *)0x0;
          local_220.d.ptr = (char16_t *)0x0;
          local_220.d.size = 0;
          ProString::toQString(&local_268,(ProString *)local_98);
          windowsifyPath(&local_250,&local_268);
          local_190 = (Data *)local_250.d.size;
          pcStack_198 = local_250.d.ptr;
          local_1a0 = (QMakeLocalFileName *)local_250.d.d;
          local_208.a.a.a = (char (*) [3])0x2a9902;
          local_208.a.b = (char (*) [2])0x2aab7e;
          local_250.d.d = (Data *)0x0;
          local_250.d.ptr = (char16_t *)0x0;
          local_250.d.size = 0;
          local_1c8._0_8_ = "s,";
          local_208.a.a.b.d.d = (Data *)0x0;
          local_1c8._8_8_ = pDVar2;
          local_1c8._16_8_ = pcVar3;
          local_208.a.a.b.d.ptr = (char16_t *)0x0;
          local_208.a.a.b.d.size = 0;
          local_1c8._24_8_ = qVar4;
          local_1a8 = (Data *)0x2aab7e;
          local_208.b.d.d = (Data *)0x0;
          local_208.b.d.ptr = (char16_t *)0x0;
          local_208.b.d.size = 0;
          local_188 = ",gi";
          pMVar10 = (MakefileGenerator *)local_1c8;
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>,_const_char_(&)[4]>
          ::convertTo<QString>
                    (&local_180,
                     (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>,_const_char_(&)[4]>
                      *)local_1c8);
          shellQuote(&local_e8,pMVar10,&local_180);
          local_168.b.d.size = local_e8.d.size;
          local_168.b.d.ptr = local_e8.d.ptr;
          local_168.b.d.d = local_e8.d.d;
          local_168.a = (char (*) [5])0x2a98fd;
          local_e8.d.d = (Data *)0x0;
          local_e8.d.ptr = (char16_t *)0x0;
          local_e8.d.size = 0;
          ::operator+=(__return_storage_ptr__,&local_168);
          if (&(local_168.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_168.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_168.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_168.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate(&(local_168.b.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_180.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_180.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_180.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_180.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_180.d.d)->super_QArrayData,2,0x10);
            }
          }
          QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
                             *)local_1c8);
          QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
          ::~QStringBuilder(&local_208);
          if ((QMakeLocalFileName *)local_250.d.d != (QMakeLocalFileName *)0x0) {
            LOCK();
            ((__atomic_base<int> *)&(((QString *)&(local_250.d.d)->super_QArrayData)->d).d)->_M_i =
                 ((__atomic_base<int> *)&(((QString *)&(local_250.d.d)->super_QArrayData)->d).d)->
                 _M_i + -1;
            UNLOCK();
            if (((__atomic_base<int> *)&(((QString *)&(local_250.d.d)->super_QArrayData)->d).d)->
                _M_i == 0) {
              QArrayData::deallocate(&(local_250.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_268.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_268.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_220.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_220.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_220.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_220.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_220.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_238.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_238.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_238.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_238.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_238.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
        }
      }
      uVar11 = uVar11 + 1;
      lVar9 = lVar9 + 0x30;
    } while (uVar11 < (ulong)(pPVar8->super_QList<ProString>).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString MakefileGenerator::createSedArgs(const ProKey &replace_rule, const QString &file_name) const
{
    QString sedargs;
    if (!project->isEmpty(replace_rule) && !project->isActiveConfig("no_sed_meta_install")) {
        const ProStringList &replace_rules = project->values(replace_rule);
        for (int r = 0; r < replace_rules.size(); ++r) {
            const ProString match = project->first(ProKey(replace_rules.at(r) + ".match")),
                            replace = project->first(ProKey(replace_rules.at(r) + ".replace")),
                            filename = project->first(ProKey(replace_rules.at(r) + ".filename"));
            if (!match.isEmpty() /*&& match != replace*/
                && (filename.isEmpty() || filename == file_name)) {
                sedargs += " -e " + shellQuote("s," + match + "," + replace + ",g");
                if (isWindowsShell()
                    && project->first(ProKey(replace_rules.at(r) + ".CONFIG")).contains("path"))
                    sedargs += " -e "
                            + shellQuote("s," + windowsifyPath(match.toQString()) + ","
                                         + windowsifyPath(replace.toQString()) + ",gi");
            }
        }
    }
    return sedargs;
}